

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

faup_feature_t faup_options_field_get_feature(faup_handler_t *fh,faup_url_field_t field)

{
  long lVar1;
  faup_feature_t fVar2;
  faup_feature_t fVar3;
  long lStack_8;
  
  if ((field & FAUP_URL_FIELD_SCHEME) == 0) {
    if ((field & FAUP_URL_FIELD_CREDENTIAL) == 0) {
      if ((field & FAUP_URL_FIELD_SUBDOMAIN) == 0) {
        if ((field & FAUP_URL_FIELD_DOMAIN) == 0) {
          if ((field & FAUP_URL_FIELD_DOMAIN_WITHOUT_TLD) == 0) {
            if ((char)field < '\0') {
              lVar1 = 0x40;
              lStack_8 = 0x38;
            }
            else if ((field >> 8 & 1) == 0) {
              if ((field >> 9 & 1) == 0) {
                if ((field >> 10 & 1) == 0) {
                  if ((field >> 0xb & 1) == 0) {
                    if ((field >> 0xc & 1) == 0) {
                      fVar2.size = 0xffffffff;
                      fVar2.field = FAUP_FEATURES_FIELD_SCHEME;
                      fVar2.pos = -1;
                      return fVar2;
                    }
                    lVar1 = 0xa0;
                    lStack_8 = 0x98;
                  }
                  else {
                    lVar1 = 0x94;
                    lStack_8 = 0x8c;
                  }
                }
                else {
                  lVar1 = 0x88;
                  lStack_8 = 0x80;
                }
              }
              else {
                lVar1 = 0x7c;
                lStack_8 = 0x74;
              }
            }
            else {
              lVar1 = 0x70;
              lStack_8 = 0x68;
            }
          }
          else {
            lVar1 = 0x58;
            lStack_8 = 0x50;
          }
        }
        else {
          lVar1 = 0x4c;
          lStack_8 = 0x44;
        }
      }
      else {
        lVar1 = 100;
        lStack_8 = 0x5c;
      }
    }
    else {
      lVar1 = 0x34;
      lStack_8 = 0x2c;
    }
  }
  else {
    lVar1 = 0x1c;
    lStack_8 = 0x14;
  }
  fVar3.size = *(uint32_t *)((long)&(fh->faup).org_str + lVar1);
  fVar3._0_8_ = *(undefined8 *)((long)&(fh->faup).org_str + lStack_8);
  return fVar3;
}

Assistant:

faup_feature_t faup_options_field_get_feature(faup_handler_t const *fh, faup_url_field_t field)
{
	faup_feature_t error;
	error.pos = -1;
	error.size = -1;

	if (field & FAUP_URL_FIELD_SCHEME) {
		return fh->faup.features.scheme;
	}
	if (field & FAUP_URL_FIELD_CREDENTIAL) {
		return fh->faup.features.credential;
	}
	if (field & FAUP_URL_FIELD_SUBDOMAIN) {
		return fh->faup.features.subdomain;
	}
	if (field & FAUP_URL_FIELD_DOMAIN) {
		return fh->faup.features.domain;
	}
	if (field & FAUP_URL_FIELD_DOMAIN_WITHOUT_TLD) {
		return fh->faup.features.domain_without_tld;
	}
	if (field & FAUP_URL_FIELD_HOST) {
		return fh->faup.features.host;
	}
	if (field & FAUP_URL_FIELD_TLD) {
		return fh->faup.features.tld;
	}
	if (field & FAUP_URL_FIELD_PORT) {
		return fh->faup.features.port;
	}
	if (field & FAUP_URL_FIELD_RESOURCE_PATH) {
		return fh->faup.features.resource_path;
	}
	if (field & FAUP_URL_FIELD_QUERY_STRING) {
		return fh->faup.features.query_string;
	}
	if (field & FAUP_URL_FIELD_FRAGMENT) {
		return fh->faup.features.fragment;
	}
	if (field & FAUP_URL_FIELD_URL_TYPE) {
		return error;
	}

	return error;
}